

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testinput.cpp
# Opt level: O1

void __thiscall
my_input_handlers::Input_Event_Notify
          (my_input_handlers *this,Am_Drawonable *draw,Am_Input_Event *ev)

{
  long *plVar1;
  undefined1 uVar2;
  byte bVar3;
  char cVar4;
  int iVar5;
  ostream *poVar6;
  size_t sVar7;
  char *in_RCX;
  undefined7 uVar9;
  ulong uVar8;
  long lVar10;
  char *pcVar11;
  Am_Input_Char AVar12;
  bool bVar13;
  bool bVar14;
  Am_Input_Char ic2;
  Am_Value v2;
  Am_Value v;
  char s [100];
  Am_Input_Char local_e4;
  Am_Input_Char local_e0;
  Am_Input_Char local_dc;
  Am_Input_Char local_d8;
  Am_Input_Char local_d4;
  Am_Input_Char local_d0;
  Am_Input_Char local_cc;
  Am_Input_Char local_c8;
  Am_Input_Char local_c4;
  Am_Input_Char local_c0;
  Am_Input_Char local_bc;
  Am_Input_Char local_b8 [4];
  Am_Value local_a8 [16];
  char local_98 [112];
  
  Am_Input_Char::As_Short_String((char *)ev);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"My Input Event \"",0x10)
  ;
  poVar6 = (ostream *)operator<<((ostream *)&std::cout,&ev->input_char);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" short=\"",9);
  sVar7 = strlen(local_98);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_98,sVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" on ",5);
  if (d == draw) {
    pcVar11 = "d\n";
    lVar10 = 2;
LAB_001029c2:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,lVar10);
  }
  else if (d2 == draw) {
    pcVar11 = "d2\n";
    lVar10 = 3;
    goto LAB_001029c2;
  }
  Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)local_a8);
  Am_Input_Char::Am_Input_Char(&local_bc,local_a8);
  Am_Input_Char::operator_cast_to_Am_Value(local_b8);
  uVar2 = Am_Input_Char::As_Char();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"   (unsigned char)=`",0x14);
  local_e4.code._0_1_ = uVar2;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)&local_e4,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'=(char)=",9);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::ostream::_M_insert<long>((long)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," (long) ",8);
  poVar6 = std::ostream::_M_insert<long>((long)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," back to Input_Char = ",0x16);
  poVar6 = std::ostream::_M_insert<long>((long)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," new long = ",0xc);
  poVar6 = std::ostream::_M_insert<long>((long)poVar6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  AVar12 = SUB84(ev,0);
  if (test_ic_set == true) {
    bVar13 = ((uint)test_ic & 0xffff) != 0x103;
    bVar14 = (ev->input_char).code == 0x103;
    in_RCX = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar14);
    if ((bool)((bVar13 && bVar14) | ~(bVar13 || bVar14) & 1U)) {
      lVar10 = 0xb;
      pcVar11 = "   *NOT* = ";
    }
    else {
      bVar3 = Am_Input_Char::helper_check_equal(AVar12);
      in_RCX = "   *=* ";
      pcVar11 = "   *NOT* = ";
      if (bVar3 != 0) {
        pcVar11 = "   *=* ";
      }
      lVar10 = (ulong)(bVar3 ^ 1) * 4 + 7;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,lVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," test_ic (",10);
    poVar6 = (ostream *)operator<<((ostream *)&std::cout,&test_ic);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")\n",2);
    std::ostream::flush();
  }
  Am_Input_Char::Am_Input_Char(&local_c0,"CONTROL_M",true);
  bVar13 = ((uint)local_c0 & 0xffff) != 0x103;
  bVar14 = (ev->input_char).code == 0x103;
  uVar9 = (undefined7)((ulong)in_RCX >> 8);
  if ((bool)((bVar13 && bVar14) | ~(bVar13 || bVar14) & 1U)) {
LAB_00102c03:
    Am_Input_Char::Am_Input_Char(&local_c4,"CONTROL_m",true);
    bVar13 = ((uint)local_c4 & 0xffff) != 0x103;
    bVar14 = (ev->input_char).code == 0x103;
    if ((bool)((bVar13 && bVar14) | ~(bVar13 || bVar14) & 1U)) {
LAB_00102c6d:
      Am_Input_Char::Am_Input_Char(&local_c8,"CONTROL_x",true);
      bVar13 = ((uint)local_c8 & 0xffff) != 0x103;
      bVar14 = (ev->input_char).code == 0x103;
      if (!(bool)((bVar13 && bVar14) | ~(bVar13 || bVar14) & 1U)) {
        cVar4 = Am_Input_Char::helper_check_equal(AVar12);
        if (cVar4 != '\0') goto LAB_00102cb5;
      }
      Am_Input_Char::Am_Input_Char(&local_cc,"CONTROL_e",true);
      bVar13 = ((uint)local_cc & 0xffff) != 0x103;
      bVar14 = (ev->input_char).code == 0x103;
      if (!(bool)((bVar13 && bVar14) | ~(bVar13 || bVar14) & 1U)) {
        cVar4 = Am_Input_Char::helper_check_equal(AVar12);
        if (cVar4 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"==Turning off enter leave\n",0x1a);
          lVar10 = 0x188;
          goto LAB_00102e14;
        }
      }
      Am_Input_Char::Am_Input_Char(&local_d0,"CONTROL_E",true);
      bVar13 = ((uint)local_d0 & 0xffff) != 0x103;
      bVar14 = (ev->input_char).code == 0x103;
      if (!(bool)((bVar13 && bVar14) | ~(bVar13 || bVar14) & 1U)) {
        cVar4 = Am_Input_Char::helper_check_equal(AVar12);
        if (cVar4 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"==Turning on enter leave\n",0x19);
          uVar8 = CONCAT71(uVar9,1);
          lVar10 = 0x188;
          goto LAB_00102e5d;
        }
      }
      Am_Input_Char::Am_Input_Char(&local_d4,"CONTROL_w",true);
      bVar13 = ((uint)local_d4 & 0xffff) != 0x103;
      bVar14 = (ev->input_char).code == 0x103;
      if (!(bool)((bVar13 && bVar14) | ~(bVar13 || bVar14) & 1U)) {
        cVar4 = Am_Input_Char::helper_check_equal(AVar12);
        if (cVar4 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"==Turning off multiple windows\n",0x1f);
          lVar10 = 0x198;
          goto LAB_00102e14;
        }
      }
      Am_Input_Char::Am_Input_Char(&local_d8,"CONTROL_W",true);
      bVar13 = Am_Input_Char::operator==(&ev->input_char,local_d8);
      if (!bVar13) {
        Am_Input_Char::Am_Input_Char(&local_dc,"CONTROL_t",true);
        bVar13 = Am_Input_Char::operator==(&ev->input_char,local_dc);
        if (bVar13) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"type new input string to test against: ",0x27);
          lVar10 = *(long *)(_ITM_registerTMCloneTable + *(long *)(std::cin + -0x18));
          std::__istream_extract((istream *)&std::cin,local_98,100);
          if (((*(int *)(Am_Drawonable::Get_Root_Drawonable + *(long *)(std::cin + -0x18)) == 0) &&
              (lVar10 - 0x65U < 0xffffffffffffff9c)) &&
             (plVar1 = *(long **)(*(long *)(std::cin + -0x18) + 0x1071f8),
             (ulong)plVar1[3] <= (ulong)plVar1[2])) {
            iVar5 = (**(code **)(*plVar1 + 0x48))();
            if (iVar5 == -1) {
              std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x107110);
            }
          }
          Am_Input_Char::Am_Input_Char(&local_e4,local_98,true);
          Am_Input_Char::operator=(&test_ic,&local_e4);
          test_ic_set = true;
        }
        else {
          Am_Input_Char::Am_Input_Char(&local_e0,"CONTROL_q",true);
          bVar13 = Am_Input_Char::operator==(&ev->input_char,local_e0);
          if (bVar13) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Quitting\n",9)
            ;
            std::ostream::flush();
            exit(0);
          }
        }
        goto LAB_00102e69;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"==Turning on multiple windows\n",0x1e);
      uVar8 = CONCAT71(uVar9,1);
      lVar10 = 0x198;
    }
    else {
      cVar4 = Am_Input_Char::helper_check_equal(AVar12);
      if (cVar4 == '\0') goto LAB_00102c6d;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"==Turning off want move\n",0x18);
      lVar10 = 400;
LAB_00102e14:
      uVar8 = 0;
    }
  }
  else {
    cVar4 = Am_Input_Char::helper_check_equal(AVar12);
    if (cVar4 == '\0') goto LAB_00102c03;
LAB_00102cb5:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"==Turning on want move\n",0x17);
    uVar8 = CONCAT71(uVar9,1);
    lVar10 = 400;
  }
LAB_00102e5d:
  (**(code **)(*(long *)draw + lVar10))(draw,uVar8 & 0xff,*(long *)draw,uVar8);
LAB_00102e69:
  Am_Value::~Am_Value((Am_Value *)local_b8);
  Am_Value::~Am_Value(local_a8);
  return;
}

Assistant:

void Input_Event_Notify(Am_Drawonable *draw, Am_Input_Event *ev) override
  {
    char s[100];

    ev->input_char.As_Short_String(s);
    cout << "My Input Event \"" << ev->input_char << "\" short=\"" << s
         << "\" on ";
    if (draw == d)
      cout << "d\n";
    else if (draw == d2)
      cout << "d2\n";

    Am_Value v = Am_Value(ev->input_char);
    Am_Input_Char ic2 = v;
    Am_Value v2 = Am_Value(ic2);
    unsigned char c = ev->input_char.As_Char();

    cout << "   (unsigned char)=`" << c << "'=(char)=" << (unsigned int)c
         << (long)c << " (long) " << v.value.long_value
         << " back to Input_Char = " << v2.value.long_value
         << " new long = " << v2.value.long_value << endl;

    if (test_ic_set) {
      if (ev->input_char == test_ic)
        cout << "   *=* ";
      else
        cout << "   *NOT* = ";
      cout << " test_ic (" << test_ic << ")\n" << flush;
    }
    if (ev->input_char == "CONTROL_M") {
      cout << "==Turning on want move\n";
      draw->Set_Want_Move(true);
    } else if (ev->input_char == "CONTROL_m") {
      cout << "==Turning off want move\n";
      draw->Set_Want_Move(false);
    } else if (ev->input_char == "CONTROL_x") {
      cout << "==Turning on want move\n";
      draw->Set_Want_Move(true);
    } else if (ev->input_char == "CONTROL_e") {
      cout << "==Turning off enter leave\n";
      draw->Set_Enter_Leave(false);
    } else if (ev->input_char == "CONTROL_E") {
      cout << "==Turning on enter leave\n";
      draw->Set_Enter_Leave(true);
    } else if (ev->input_char == "CONTROL_w") {
      cout << "==Turning off multiple windows\n";
      draw->Set_Multi_Window(false);
    } else if (ev->input_char == "CONTROL_W") {
      cout << "==Turning on multiple windows\n";
      draw->Set_Multi_Window(true);
    } else if (ev->input_char == "CONTROL_t") {
      cout << "type new input string to test against: ";
      cin >> s;
      test_ic = Am_Input_Char(s);
      test_ic_set = true;
    } else if (ev->input_char == "CONTROL_q") {
      cout << "Quitting\n" << flush;
      exit(0);
    }
  }